

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_5_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_b80;
  float c4s;
  float *output4;
  float *pfStack_b70;
  float c3s;
  float *output3;
  float *pfStack_b60;
  float c2s;
  float *output2;
  float *pfStack_b50;
  float c1s;
  float *output1;
  float *pfStack_b40;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  
  pfStack_b40 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_b50 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_b60 = outputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_b70 = outputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_b80 = outputs[4];
  fVar5 = vertical_coefficients[4];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_3f8 = (float)*(undefined8 *)input_end_local;
    fStack_3f4 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_3ec = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_d8 = (float)*(undefined8 *)pfStack_b40;
    fStack_d4 = (float)((ulong)*(undefined8 *)pfStack_b40 >> 0x20);
    fStack_d0 = (float)*(undefined8 *)(pfStack_b40 + 2);
    fStack_cc = (float)((ulong)*(undefined8 *)(pfStack_b40 + 2) >> 0x20);
    o1[3] = fStack_d4 + fStack_3f4 * fVar1;
    o1[2] = local_d8 + local_3f8 * fVar1;
    o0[1] = fStack_cc + fStack_3ec * fVar1;
    o0[0] = fStack_d0 + fStack_3f0 * fVar1;
    local_418 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_414 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_410 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_40c = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_f8 = (float)*(undefined8 *)(pfStack_b40 + 4);
    fStack_f4 = (float)((ulong)*(undefined8 *)(pfStack_b40 + 4) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(pfStack_b40 + 6);
    fStack_ec = (float)((ulong)*(undefined8 *)(pfStack_b40 + 6) >> 0x20);
    o2[3] = fStack_f4 + fStack_414 * fVar1;
    o2[2] = local_f8 + local_418 * fVar1;
    o1[1] = fStack_ec + fStack_40c * fVar1;
    o1[0] = fStack_f0 + fStack_410 * fVar1;
    local_438 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_434 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_430 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_42c = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_118 = (float)*(undefined8 *)(pfStack_b40 + 8);
    fStack_114 = (float)((ulong)*(undefined8 *)(pfStack_b40 + 8) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(pfStack_b40 + 10);
    fStack_10c = (float)((ulong)*(undefined8 *)(pfStack_b40 + 10) >> 0x20);
    o3[3] = fStack_114 + fStack_434 * fVar1;
    o3[2] = local_118 + local_438 * fVar1;
    o2[1] = fStack_10c + fStack_42c * fVar1;
    o2[0] = fStack_110 + fStack_430 * fVar1;
    local_458 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_454 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_450 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_44c = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    local_138 = (float)*(undefined8 *)(pfStack_b40 + 0xc);
    fStack_134 = (float)((ulong)*(undefined8 *)(pfStack_b40 + 0xc) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(pfStack_b40 + 0xe);
    fStack_12c = (float)((ulong)*(undefined8 *)(pfStack_b40 + 0xe) >> 0x20);
    r0[3] = fStack_134 + fStack_454 * fVar1;
    r0[2] = local_138 + local_458 * fVar1;
    o3[1] = fStack_12c + fStack_44c * fVar1;
    o3[0] = fStack_130 + fStack_450 * fVar1;
    *(undefined8 *)pfStack_b40 = o1._8_8_;
    *(undefined8 *)(pfStack_b40 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_b40 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_b40 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_b40 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_b40 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_b40 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_b40 + 0xe) = o3._0_8_;
    local_158 = (float)*(undefined8 *)pfStack_b50;
    fStack_154 = (float)((ulong)*(undefined8 *)pfStack_b50 >> 0x20);
    fStack_150 = (float)*(undefined8 *)(pfStack_b50 + 2);
    fStack_14c = (float)((ulong)*(undefined8 *)(pfStack_b50 + 2) >> 0x20);
    o1[3] = fStack_154 + fStack_3f4 * fVar2;
    o1[2] = local_158 + local_3f8 * fVar2;
    o0[1] = fStack_14c + fStack_3ec * fVar2;
    o0[0] = fStack_150 + fStack_3f0 * fVar2;
    local_178 = (float)*(undefined8 *)(pfStack_b50 + 4);
    fStack_174 = (float)((ulong)*(undefined8 *)(pfStack_b50 + 4) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(pfStack_b50 + 6);
    fStack_16c = (float)((ulong)*(undefined8 *)(pfStack_b50 + 6) >> 0x20);
    o2[3] = fStack_174 + fStack_414 * fVar2;
    o2[2] = local_178 + local_418 * fVar2;
    o1[1] = fStack_16c + fStack_40c * fVar2;
    o1[0] = fStack_170 + fStack_410 * fVar2;
    local_198 = (float)*(undefined8 *)(pfStack_b50 + 8);
    fStack_194 = (float)((ulong)*(undefined8 *)(pfStack_b50 + 8) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(pfStack_b50 + 10);
    fStack_18c = (float)((ulong)*(undefined8 *)(pfStack_b50 + 10) >> 0x20);
    o3[3] = fStack_194 + fStack_434 * fVar2;
    o3[2] = local_198 + local_438 * fVar2;
    o2[1] = fStack_18c + fStack_42c * fVar2;
    o2[0] = fStack_190 + fStack_430 * fVar2;
    local_1b8 = (float)*(undefined8 *)(pfStack_b50 + 0xc);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(pfStack_b50 + 0xc) >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(pfStack_b50 + 0xe);
    fStack_1ac = (float)((ulong)*(undefined8 *)(pfStack_b50 + 0xe) >> 0x20);
    r0[3] = fStack_1b4 + fStack_454 * fVar2;
    r0[2] = local_1b8 + local_458 * fVar2;
    o3[1] = fStack_1ac + fStack_44c * fVar2;
    o3[0] = fStack_1b0 + fStack_450 * fVar2;
    *(undefined8 *)pfStack_b50 = o1._8_8_;
    *(undefined8 *)(pfStack_b50 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_b50 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_b50 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_b50 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_b50 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_b50 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_b50 + 0xe) = o3._0_8_;
    local_1d8 = (float)*(undefined8 *)pfStack_b60;
    fStack_1d4 = (float)((ulong)*(undefined8 *)pfStack_b60 >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(pfStack_b60 + 2);
    fStack_1cc = (float)((ulong)*(undefined8 *)(pfStack_b60 + 2) >> 0x20);
    o1[3] = fStack_1d4 + fStack_3f4 * fVar3;
    o1[2] = local_1d8 + local_3f8 * fVar3;
    o0[1] = fStack_1cc + fStack_3ec * fVar3;
    o0[0] = fStack_1d0 + fStack_3f0 * fVar3;
    local_1f8 = (float)*(undefined8 *)(pfStack_b60 + 4);
    fStack_1f4 = (float)((ulong)*(undefined8 *)(pfStack_b60 + 4) >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(pfStack_b60 + 6);
    fStack_1ec = (float)((ulong)*(undefined8 *)(pfStack_b60 + 6) >> 0x20);
    o2[3] = fStack_1f4 + fStack_414 * fVar3;
    o2[2] = local_1f8 + local_418 * fVar3;
    o1[1] = fStack_1ec + fStack_40c * fVar3;
    o1[0] = fStack_1f0 + fStack_410 * fVar3;
    local_218 = (float)*(undefined8 *)(pfStack_b60 + 8);
    fStack_214 = (float)((ulong)*(undefined8 *)(pfStack_b60 + 8) >> 0x20);
    fStack_210 = (float)*(undefined8 *)(pfStack_b60 + 10);
    fStack_20c = (float)((ulong)*(undefined8 *)(pfStack_b60 + 10) >> 0x20);
    o3[3] = fStack_214 + fStack_434 * fVar3;
    o3[2] = local_218 + local_438 * fVar3;
    o2[1] = fStack_20c + fStack_42c * fVar3;
    o2[0] = fStack_210 + fStack_430 * fVar3;
    local_238 = (float)*(undefined8 *)(pfStack_b60 + 0xc);
    fStack_234 = (float)((ulong)*(undefined8 *)(pfStack_b60 + 0xc) >> 0x20);
    fStack_230 = (float)*(undefined8 *)(pfStack_b60 + 0xe);
    fStack_22c = (float)((ulong)*(undefined8 *)(pfStack_b60 + 0xe) >> 0x20);
    r0[3] = fStack_234 + fStack_454 * fVar3;
    r0[2] = local_238 + local_458 * fVar3;
    o3[1] = fStack_22c + fStack_44c * fVar3;
    o3[0] = fStack_230 + fStack_450 * fVar3;
    *(undefined8 *)pfStack_b60 = o1._8_8_;
    *(undefined8 *)(pfStack_b60 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_b60 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_b60 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_b60 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_b60 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_b60 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_b60 + 0xe) = o3._0_8_;
    local_258 = (float)*(undefined8 *)pfStack_b70;
    fStack_254 = (float)((ulong)*(undefined8 *)pfStack_b70 >> 0x20);
    fStack_250 = (float)*(undefined8 *)(pfStack_b70 + 2);
    fStack_24c = (float)((ulong)*(undefined8 *)(pfStack_b70 + 2) >> 0x20);
    o1[3] = fStack_254 + fStack_3f4 * fVar4;
    o1[2] = local_258 + local_3f8 * fVar4;
    o0[1] = fStack_24c + fStack_3ec * fVar4;
    o0[0] = fStack_250 + fStack_3f0 * fVar4;
    local_278 = (float)*(undefined8 *)(pfStack_b70 + 4);
    fStack_274 = (float)((ulong)*(undefined8 *)(pfStack_b70 + 4) >> 0x20);
    fStack_270 = (float)*(undefined8 *)(pfStack_b70 + 6);
    fStack_26c = (float)((ulong)*(undefined8 *)(pfStack_b70 + 6) >> 0x20);
    o2[3] = fStack_274 + fStack_414 * fVar4;
    o2[2] = local_278 + local_418 * fVar4;
    o1[1] = fStack_26c + fStack_40c * fVar4;
    o1[0] = fStack_270 + fStack_410 * fVar4;
    local_298 = (float)*(undefined8 *)(pfStack_b70 + 8);
    fStack_294 = (float)((ulong)*(undefined8 *)(pfStack_b70 + 8) >> 0x20);
    fStack_290 = (float)*(undefined8 *)(pfStack_b70 + 10);
    fStack_28c = (float)((ulong)*(undefined8 *)(pfStack_b70 + 10) >> 0x20);
    o3[3] = fStack_294 + fStack_434 * fVar4;
    o3[2] = local_298 + local_438 * fVar4;
    o2[1] = fStack_28c + fStack_42c * fVar4;
    o2[0] = fStack_290 + fStack_430 * fVar4;
    local_2b8 = (float)*(undefined8 *)(pfStack_b70 + 0xc);
    fStack_2b4 = (float)((ulong)*(undefined8 *)(pfStack_b70 + 0xc) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(pfStack_b70 + 0xe);
    fStack_2ac = (float)((ulong)*(undefined8 *)(pfStack_b70 + 0xe) >> 0x20);
    r0[3] = fStack_2b4 + fStack_454 * fVar4;
    r0[2] = local_2b8 + local_458 * fVar4;
    o3[1] = fStack_2ac + fStack_44c * fVar4;
    o3[0] = fStack_2b0 + fStack_450 * fVar4;
    *(undefined8 *)pfStack_b70 = o1._8_8_;
    *(undefined8 *)(pfStack_b70 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_b70 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_b70 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_b70 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_b70 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_b70 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_b70 + 0xe) = o3._0_8_;
    local_2d8 = (float)*(undefined8 *)pfStack_b80;
    fStack_2d4 = (float)((ulong)*(undefined8 *)pfStack_b80 >> 0x20);
    fStack_2d0 = (float)*(undefined8 *)(pfStack_b80 + 2);
    fStack_2cc = (float)((ulong)*(undefined8 *)(pfStack_b80 + 2) >> 0x20);
    o1[3] = fStack_2d4 + fStack_3f4 * fVar5;
    o1[2] = local_2d8 + local_3f8 * fVar5;
    o0[1] = fStack_2cc + fStack_3ec * fVar5;
    o0[0] = fStack_2d0 + fStack_3f0 * fVar5;
    local_2f8 = (float)*(undefined8 *)(pfStack_b80 + 4);
    fStack_2f4 = (float)((ulong)*(undefined8 *)(pfStack_b80 + 4) >> 0x20);
    fStack_2f0 = (float)*(undefined8 *)(pfStack_b80 + 6);
    fStack_2ec = (float)((ulong)*(undefined8 *)(pfStack_b80 + 6) >> 0x20);
    o2[3] = fStack_2f4 + fStack_414 * fVar5;
    o2[2] = local_2f8 + local_418 * fVar5;
    o1[1] = fStack_2ec + fStack_40c * fVar5;
    o1[0] = fStack_2f0 + fStack_410 * fVar5;
    local_318 = (float)*(undefined8 *)(pfStack_b80 + 8);
    fStack_314 = (float)((ulong)*(undefined8 *)(pfStack_b80 + 8) >> 0x20);
    fStack_310 = (float)*(undefined8 *)(pfStack_b80 + 10);
    fStack_30c = (float)((ulong)*(undefined8 *)(pfStack_b80 + 10) >> 0x20);
    o3[3] = fStack_314 + fStack_434 * fVar5;
    o3[2] = local_318 + local_438 * fVar5;
    o2[1] = fStack_30c + fStack_42c * fVar5;
    o2[0] = fStack_310 + fStack_430 * fVar5;
    local_338 = (float)*(undefined8 *)(pfStack_b80 + 0xc);
    fStack_334 = (float)((ulong)*(undefined8 *)(pfStack_b80 + 0xc) >> 0x20);
    fStack_330 = (float)*(undefined8 *)(pfStack_b80 + 0xe);
    fStack_32c = (float)((ulong)*(undefined8 *)(pfStack_b80 + 0xe) >> 0x20);
    r0[3] = fStack_334 + fStack_454 * fVar5;
    r0[2] = local_338 + local_458 * fVar5;
    o3[1] = fStack_32c + fStack_44c * fVar5;
    o3[0] = fStack_330 + fStack_450 * fVar5;
    *(undefined8 *)pfStack_b80 = o1._8_8_;
    *(undefined8 *)(pfStack_b80 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_b80 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_b80 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_b80 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_b80 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_b80 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_b80 + 0xe) = o3._0_8_;
    pfStack_b40 = pfStack_b40 + 0x10;
    pfStack_b50 = pfStack_b50 + 0x10;
    pfStack_b60 = pfStack_b60 + 0x10;
    pfStack_b70 = pfStack_b70 + 0x10;
    pfStack_b80 = pfStack_b80 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_678 = (float)*(undefined8 *)input_end_local;
    fStack_674 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_670 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_66c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_358 = (float)*(undefined8 *)pfStack_b40;
    fStack_354 = (float)((ulong)*(undefined8 *)pfStack_b40 >> 0x20);
    fStack_350 = (float)*(undefined8 *)(pfStack_b40 + 2);
    fStack_34c = (float)((ulong)*(undefined8 *)(pfStack_b40 + 2) >> 0x20);
    r0_1[3] = fStack_354 + fStack_674 * fVar1;
    r0_1[2] = local_358 + local_678 * fVar1;
    o0_1[1] = fStack_34c + fStack_66c * fVar1;
    o0_1[0] = fStack_350 + fStack_670 * fVar1;
    *(undefined8 *)pfStack_b40 = r0_1._8_8_;
    *(undefined8 *)(pfStack_b40 + 2) = o0_1._0_8_;
    local_378 = (float)*(undefined8 *)pfStack_b50;
    fStack_374 = (float)((ulong)*(undefined8 *)pfStack_b50 >> 0x20);
    fStack_370 = (float)*(undefined8 *)(pfStack_b50 + 2);
    fStack_36c = (float)((ulong)*(undefined8 *)(pfStack_b50 + 2) >> 0x20);
    r0_1[3] = fStack_374 + fStack_674 * fVar2;
    r0_1[2] = local_378 + local_678 * fVar2;
    o0_1[1] = fStack_36c + fStack_66c * fVar2;
    o0_1[0] = fStack_370 + fStack_670 * fVar2;
    *(undefined8 *)pfStack_b50 = r0_1._8_8_;
    *(undefined8 *)(pfStack_b50 + 2) = o0_1._0_8_;
    local_398 = (float)*(undefined8 *)pfStack_b60;
    fStack_394 = (float)((ulong)*(undefined8 *)pfStack_b60 >> 0x20);
    fStack_390 = (float)*(undefined8 *)(pfStack_b60 + 2);
    fStack_38c = (float)((ulong)*(undefined8 *)(pfStack_b60 + 2) >> 0x20);
    r0_1[3] = fStack_394 + fStack_674 * fVar3;
    r0_1[2] = local_398 + local_678 * fVar3;
    o0_1[1] = fStack_38c + fStack_66c * fVar3;
    o0_1[0] = fStack_390 + fStack_670 * fVar3;
    *(undefined8 *)pfStack_b60 = r0_1._8_8_;
    *(undefined8 *)(pfStack_b60 + 2) = o0_1._0_8_;
    local_3b8 = (float)*(undefined8 *)pfStack_b70;
    fStack_3b4 = (float)((ulong)*(undefined8 *)pfStack_b70 >> 0x20);
    fStack_3b0 = (float)*(undefined8 *)(pfStack_b70 + 2);
    fStack_3ac = (float)((ulong)*(undefined8 *)(pfStack_b70 + 2) >> 0x20);
    r0_1[3] = fStack_3b4 + fStack_674 * fVar4;
    r0_1[2] = local_3b8 + local_678 * fVar4;
    o0_1[1] = fStack_3ac + fStack_66c * fVar4;
    o0_1[0] = fStack_3b0 + fStack_670 * fVar4;
    *(undefined8 *)pfStack_b70 = r0_1._8_8_;
    *(undefined8 *)(pfStack_b70 + 2) = o0_1._0_8_;
    local_3d8 = (float)*(undefined8 *)pfStack_b80;
    fStack_3d4 = (float)((ulong)*(undefined8 *)pfStack_b80 >> 0x20);
    fStack_3d0 = (float)*(undefined8 *)(pfStack_b80 + 2);
    fStack_3cc = (float)((ulong)*(undefined8 *)(pfStack_b80 + 2) >> 0x20);
    r0_1[3] = fStack_3d4 + fStack_674 * fVar5;
    r0_1[2] = local_3d8 + local_678 * fVar5;
    o0_1[1] = fStack_3cc + fStack_66c * fVar5;
    o0_1[0] = fStack_3d0 + fStack_670 * fVar5;
    *(undefined8 *)pfStack_b80 = r0_1._8_8_;
    *(undefined8 *)(pfStack_b80 + 2) = o0_1._0_8_;
    pfStack_b40 = pfStack_b40 + 4;
    pfStack_b50 = pfStack_b50 + 4;
    pfStack_b60 = pfStack_b60 + 4;
    pfStack_b70 = pfStack_b70 + 4;
    pfStack_b80 = pfStack_b80 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar6 = *input_end_local;
    *pfStack_b40 = fVar6 * fVar1 + *pfStack_b40;
    *pfStack_b50 = fVar6 * fVar2 + *pfStack_b50;
    *pfStack_b60 = fVar6 * fVar3 + *pfStack_b60;
    *pfStack_b70 = fVar6 * fVar4 + *pfStack_b70;
    *pfStack_b80 = fVar6 * fVar5 + *pfStack_b80;
    pfStack_b40 = pfStack_b40 + 1;
    pfStack_b50 = pfStack_b50 + 1;
    pfStack_b60 = pfStack_b60 + 1;
    pfStack_b70 = pfStack_b70 + 1;
    pfStack_b80 = pfStack_b80 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}